

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O1

void mserialize::detail::
     BuiltinDeserializer<std::shared_ptr<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>::
     deserialize<InputStream>
               (shared_ptr<std::unique_ptr<int,_std::default_delete<int>_>_> *opt,
               InputStream *istream)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  unique_ptr<int,_std::default_delete<int>_> *__p;
  uint8_t discriminator;
  char local_19;
  
  std::istream::read((char *)istream->stream,(long)&local_19);
  if (local_19 == '\0') {
    this = (opt->
           super___shared_ptr<std::unique_ptr<int,_std::default_delete<int>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
    (opt->
    super___shared_ptr<std::unique_ptr<int,_std::default_delete<int>_>,_(__gnu_cxx::_Lock_policy)2>)
    ._M_ptr = (element_type *)0x0;
    (opt->
    super___shared_ptr<std::unique_ptr<int,_std::default_delete<int>_>,_(__gnu_cxx::_Lock_policy)2>)
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
  }
  else {
    __p = (unique_ptr<int,_std::default_delete<int>_> *)operator_new(8);
    (__p->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (int *)0x0;
    std::__shared_ptr<std::unique_ptr<int,std::default_delete<int>>,(__gnu_cxx::_Lock_policy)2>::
    reset<std::unique_ptr<int,std::default_delete<int>>>
              ((__shared_ptr<std::unique_ptr<int,std::default_delete<int>>,(__gnu_cxx::_Lock_policy)2>
                *)opt,__p);
    BuiltinDeserializer<std::unique_ptr<int,_std::default_delete<int>_>,_void>::
    deserialize<InputStream>
              ((opt->
               super___shared_ptr<std::unique_ptr<int,_std::default_delete<int>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr,istream);
  }
  return;
}

Assistant:

static void deserialize(Optional& opt, InputStream& istream)
  {
    std::uint8_t discriminator;
    mserialize::deserialize(discriminator, istream);
    if (discriminator)
    {
      assert(discriminator == 1 && "Discriminator of non-empty optional must be 1");
      make_nonempty(opt);
      mserialize::deserialize(*opt, istream);
    }
    else
    {
      opt = {};
    }
  }